

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionPosition_line::ChFunctionPosition_line(ChFunctionPosition_line *this)

{
  __shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined4 local_1c;
  undefined8 local_18;
  
  (this->super_ChFunctionPosition)._vptr_ChFunctionPosition =
       (_func_int **)&PTR__ChFunctionPosition_line_011927a0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<chrono::geometry::ChLineSegment>();
  std::__shared_ptr<chrono::geometry::ChLine,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::geometry::ChLine,(__gnu_cxx::_Lock_policy)2> *)
             &this->trajectory_line,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  local_1c = 0;
  local_18 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Ramp,int,double>((int *)&local_30,(double *)&local_1c);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->space_fx,
             (__shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

ChFunctionPosition_line::ChFunctionPosition_line() {

	// default trajectory is a segment
    this->trajectory_line = chrono_types::make_shared<geometry::ChLineSegment>();

	// default s(t) function. User will provide better fx.
    space_fx = chrono_types::make_shared<ChFunction_Ramp>(0, 1.);

}